

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt64(Value *this)

{
  char cVar1;
  bool local_29;
  Value *this_local;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x01') {
    this_local._7_1_ = true;
  }
  else if (cVar1 == '\x02') {
    this_local._7_1_ = (this->value_).uint_ < 0x8000000000000000;
  }
  else if (cVar1 == '\x03') {
    local_29 = false;
    if ((-9.223372036854776e+18 <= (this->value_).real_) &&
       (local_29 = false,
       (this->value_).real_ <= 9.223372036854776e+18 &&
       (this->value_).real_ != 9.223372036854776e+18)) {
      local_29 = IsIntegral((this->value_).real_);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}